

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_tester.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::CommandLineInterfaceTester::CreateTempFile
          (CommandLineInterfaceTester *this,string_view name,string_view contents)

{
  size_t sVar1;
  bool bVar2;
  size_type __n;
  Nonnull<const_char_*> pcVar3;
  size_type in_R9;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  string_view s;
  FixedMapping replacements;
  string_view contents_00;
  Status local_100;
  string full_name;
  string local_d0;
  string_view name_local;
  AlphaNum local_90;
  AlphaNum local_60;
  
  name_local._M_str = name._M_str;
  name_local._M_len = name._M_len;
  __n = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                  (&name_local,'/',0xffffffffffffffff);
  if (__n != 0xffffffffffffffff) {
    bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&name_local,0,__n);
    local_d0._M_string_length = (size_type)(this->temp_directory_)._M_dataplus._M_p;
    local_d0._M_dataplus._M_p = (pointer)(this->temp_directory_)._M_string_length;
    local_60.piece_ = absl::lts_20250127::NullSafeStringView("/");
    local_90.piece_ = bVar4;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&full_name,(lts_20250127 *)&local_d0,&local_60,&local_90,&local_60);
    bVar2 = File::Exists(&full_name);
    std::__cxx11::string::~string((string *)&full_name);
    if (!bVar2) {
      local_d0._M_string_length = (size_type)(this->temp_directory_)._M_dataplus._M_p;
      local_d0._M_dataplus._M_p = (pointer)(this->temp_directory_)._M_string_length;
      local_60.piece_ = absl::lts_20250127::NullSafeStringView("/");
      local_90.piece_ = bVar4;
      absl::lts_20250127::StrCat_abi_cxx11_
                (&full_name,(lts_20250127 *)&local_d0,&local_60,&local_90,&local_60);
      File::RecursivelyCreateDir((File *)&local_100,&full_name,0x1ff);
      if (local_100.rep_ == 1) {
        pcVar3 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar3 = absl::lts_20250127::status_internal::MakeCheckFailString
                           (&local_100,
                            "File::RecursivelyCreateDir( absl::StrCat(temp_directory_, \"/\", dir), 0777) is OK"
                           );
      }
      absl::lts_20250127::Status::~Status(&local_100);
      std::__cxx11::string::~string((string *)&full_name);
      if (local_100.rep_ != 1) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_tester.cc"
                   ,99,pcVar3);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_d0);
      }
    }
  }
  local_d0._M_string_length = (size_type)(this->temp_directory_)._M_dataplus._M_p;
  local_d0._M_dataplus._M_p = (pointer)(this->temp_directory_)._M_string_length;
  local_60.piece_ = absl::lts_20250127::NullSafeStringView("/");
  local_90.piece_._M_str = name_local._M_str;
  local_90.piece_._M_len = name_local._M_len;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&full_name,(lts_20250127 *)&local_d0,&local_60,&local_90,&local_60);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::
  pair<const_char_(&)[8],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
              *)&local_60,(char (*) [8])0xe82ec4,&this->temp_directory_);
  s._M_str = (char *)&local_60;
  s._M_len = (size_t)contents._M_str;
  replacements._M_len = in_R9;
  replacements._M_array = (iterator)0x1;
  absl::lts_20250127::StrReplaceAll_abi_cxx11_
            (&local_d0,(lts_20250127 *)contents._M_len,s,replacements);
  contents_00._M_str = (char *)local_d0._M_string_length;
  contents_00._M_len = (size_t)&local_90;
  File::WriteStringToFile(contents_00,(string *)local_d0._M_dataplus._M_p);
  sVar1 = local_90.piece_._M_len;
  if (local_90.piece_._M_len == 1) {
    pcVar3 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar3 = absl::lts_20250127::status_internal::MakeCheckFailString
                       ((Nonnull<const_absl::Status_*>)&local_90,
                        "File::SetContents( full_name, absl::StrReplaceAll(contents, {{\"$tmpdir\", temp_directory_}}), true) is OK"
                       );
  }
  absl::lts_20250127::Status::~Status((Status *)&local_90);
  std::__cxx11::string::~string((string *)&local_d0);
  if (sVar1 == 1) {
    std::__cxx11::string::~string((string *)&full_name);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_d0,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_tester.cc"
             ,0x6b,pcVar3);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_d0);
}

Assistant:

void CommandLineInterfaceTester::CreateTempFile(absl::string_view name,
                                                absl::string_view contents) {
  // Create parent directory, if necessary.
  std::string::size_type slash_pos = name.find_last_of('/');
  if (slash_pos != std::string::npos) {
    absl::string_view dir = name.substr(0, slash_pos);
    if (!FileExists(absl::StrCat(temp_directory_, "/", dir))) {
      ABSL_CHECK_OK(File::RecursivelyCreateDir(
          absl::StrCat(temp_directory_, "/", dir), 0777));
    }
  }

  // Write file.
  std::string full_name = absl::StrCat(temp_directory_, "/", name);
  ABSL_CHECK_OK(File::SetContents(
      full_name, absl::StrReplaceAll(contents, {{"$tmpdir", temp_directory_}}),
      true));
}